

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ma.c
# Opt level: O2

Boolean MA_push_get(Integer datatype,Integer nelem,char *name,Integer *memhandle,
                   MA_AccessIndex *index)

{
  Boolean BVar1;
  
  ma_stats.calls[0x16] = ma_stats.calls[0x16] + 1;
  BVar1 = MA_push_stack(datatype,nelem,name,memhandle);
  if (BVar1 != 0) {
    BVar1 = MA_get_index(*memhandle,index);
    return BVar1;
  }
  return 0;
}

Assistant:

public Boolean MA_push_get(
    Integer    datatype,    /* of elements in this block */
    Integer    nelem,        /* # of elements in this block */
    const char    *name,        /* assigned to this block by client */
    Integer    *memhandle,    /* RETURN: handle for this block */
    MA_AccessIndex  *index    /* RETURN: index for this block */)
{
#ifdef STATS
    ma_stats.calls[(int)FID_MA_push_get]++;
#endif /* STATS */

    if (MA_push_stack(datatype, nelem, name, memhandle))
        /* MA_push_stack succeeded; try MA_get_index */
        return MA_get_index(*memhandle, index);
    else
        /* MA_push_stack failed */
        return MA_FALSE;
}